

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestRuntimeFail.cpp
# Opt level: O3

void __thiscall Test_testMultipleTransitions::Run(Test_testMultipleTransitions *this)

{
  nullres nVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  long lVar5;
  
  if (Tests::messageVerbose == '\x01') {
    puts("Call stack when there are various transitions between NULLC and C\r");
  }
  lVar5 = 0;
  do {
    if ((&Tests::testFailureExecutor)[lVar5] == '\x01') {
      testsCount[lVar5] = testsCount[lVar5] + 1;
      nullcSetExecutor(testTarget[lVar5]);
      nVar1 = nullcBuild(testCallStackWhenVariousTransitions);
      if (nVar1 == '\0') {
        if (Tests::messageVerbose == '\0') {
          puts("Call stack when there are various transitions between NULLC and C\r");
        }
        pcVar4 = nullcGetLastError();
        printf("Compilation failed: %s\r\n",pcVar4);
        return;
      }
      nVar1 = nullcRun();
      pcVar4 = error;
      if (nVar1 == '\0') {
        pcVar3 = nullcGetLastError();
        iVar2 = strcmp(pcVar4,pcVar3);
        if (iVar2 == 0) {
          testsPassed[lVar5] = testsPassed[lVar5] + 1;
        }
        else {
          if (Tests::messageVerbose == '\0') {
            puts("Call stack when there are various transitions between NULLC and C\r");
          }
          pcVar4 = "REGVM";
          if (testTarget[lVar5] == 2) {
            pcVar4 = "LLVM";
          }
          if (testTarget[lVar5] == 1) {
            pcVar4 = "X86";
          }
          pcVar3 = nullcGetLastError();
          printf("%s failed but for wrong reason:\r\n    %s\r\nexpected:\r\n    %s\r\n",pcVar4,
                 pcVar3,error);
        }
      }
      else {
        if (Tests::messageVerbose == '\0') {
          puts("Call stack when there are various transitions between NULLC and C\r");
        }
        puts("Test should have failed.\r");
      }
    }
    lVar5 = lVar5 + 1;
  } while (lVar5 != 3);
  return;
}

Assistant:

virtual void Run()
	{
		if(Tests::messageVerbose)
			printf("Call stack when there are various transitions between NULLC and C\r\n");
		for(int t = 0; t < TEST_TARGET_COUNT; t++)
		{
			if(!Tests::testFailureExecutor[t])
				continue;
			testsCount[t]++;
			nullcSetExecutor(testTarget[t]);
			nullres good = nullcBuild(testCallStackWhenVariousTransitions);
			if(!good)
			{
				if(!Tests::messageVerbose)
					printf("Call stack when there are various transitions between NULLC and C\r\n");
				printf("Compilation failed: %s\r\n", nullcGetLastError());
				break;
			}
			good = nullcRun();
			if(!good)
			{
				if(strcmp(error, nullcGetLastError()) != 0)
				{
					if(!Tests::messageVerbose)
						printf("Call stack when there are various transitions between NULLC and C\r\n");

					const char *targetName = testTarget[t] == NULLC_X86 ? "X86" : (testTarget[t] == NULLC_LLVM ? "LLVM" : "REGVM");

					printf("%s failed but for wrong reason:\r\n    %s\r\nexpected:\r\n    %s\r\n", targetName, nullcGetLastError(), error);
				}else{
					testsPassed[t]++;
				}
			}else{
				if(!Tests::messageVerbose)
					printf("Call stack when there are various transitions between NULLC and C\r\n");
				printf("Test should have failed.\r\n");
			}
		}
	}